

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StyledStreamWriter::writeValue(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  Json *pJVar2;
  Value *root;
  uint length;
  bool value_00;
  LargestUInt value_01;
  char *value_02;
  LargestInt value_03;
  pointer key;
  double value_04;
  char *end;
  char *str;
  string sStack_78;
  allocator local_51;
  char *local_50;
  Members local_48;
  
  length = 0x18195c;
  switch(value->field_0x8) {
  case 0:
    std::__cxx11::string::string((string *)&sStack_78,"null",(allocator *)&local_48);
    pushValue(this,&sStack_78);
    break;
  case 1:
    pJVar2 = (Json *)Json::Value::asInt64(value);
    valueToString_abi_cxx11_(&sStack_78,pJVar2,value_03);
    pushValue(this,&sStack_78);
    break;
  case 2:
    pJVar2 = (Json *)Json::Value::asUInt64(value);
    valueToString_abi_cxx11_(&sStack_78,pJVar2,value_01);
    pushValue(this,&sStack_78);
    break;
  case 3:
    value_04 = Json::Value::asDouble(value);
    valueToString_abi_cxx11_(&sStack_78,(Json *)value,value_04);
    pushValue(this,&sStack_78);
    break;
  case 4:
    bVar1 = Json::Value::getString(value,(char **)&local_48,&local_50);
    if (bVar1) {
      valueToQuotedStringN_abi_cxx11_
                (&sStack_78,
                 (Json *)local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (char *)(ulong)(uint)((int)local_50 -
                                      (int)local_48.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start),length);
      pushValue(this,&sStack_78);
    }
    else {
      std::__cxx11::string::string((string *)&sStack_78,"",&local_51);
      pushValue(this,&sStack_78);
    }
    break;
  case 5:
    bVar1 = Json::Value::asBool(value);
    valueToString_abi_cxx11_(&sStack_78,(Json *)(ulong)bVar1,value_00);
    pushValue(this,&sStack_78);
    break;
  case 6:
    writeArrayValue(this,value);
    return;
  case 7:
    Json::Value::getMemberNames_abi_cxx11_(&local_48,value);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&sStack_78,"{}",(allocator *)&local_50);
      pushValue(this,&sStack_78);
    }
    else {
      std::__cxx11::string::string((string *)&sStack_78,"{",(allocator *)&local_50);
      writeWithIndent(this,&sStack_78);
      std::__cxx11::string::~string((string *)&sStack_78);
      indent(this);
      key = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        root = Json::Value::operator[](value,key);
        writeCommentBeforeValue(this,root);
        valueToQuotedString_abi_cxx11_(&sStack_78,(Json *)(key->_M_dataplus)._M_p,value_02);
        writeWithIndent(this,&sStack_78);
        std::__cxx11::string::~string((string *)&sStack_78);
        std::operator<<(this->document_," : ");
        writeValue(this,root);
        key = key + 1;
        if (key == local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) break;
        std::operator<<(this->document_,",");
        writeCommentAfterValueOnSameLine(this,root);
      }
      writeCommentAfterValueOnSameLine(this,root);
      unindent(this);
      std::__cxx11::string::string((string *)&sStack_78,"}",(allocator *)&local_50);
      writeWithIndent(this,&sStack_78);
    }
    std::__cxx11::string::~string((string *)&sStack_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_001251f0_default;
  }
  std::__cxx11::string::~string((string *)&sStack_78);
switchD_001251f0_default:
  return;
}

Assistant:

ValueType Value::type() const { return type_; }